

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgm2wav.cpp
# Opt level: O0

char * fmt_time(double sec)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  uint i_hour;
  uint i_min;
  uint i_sec;
  double sec_local;
  
  fmt_time::ts[0] = '\0';
  uVar1 = (uint)(long)sec / 0x3c;
  uVar2 = uVar1 / 0x3c;
  uVar1 = uVar1 % 0x3c;
  if (uVar2 != 0) {
    snprintf(fmt_time::ts,4,"%02u:",(ulong)uVar2);
  }
  if (uVar1 != 0) {
    sVar3 = strlen(fmt_time::ts);
    snprintf(fmt_time::ts + sVar3,4,"%02u:",(ulong)uVar1);
  }
  sVar3 = strlen(fmt_time::ts);
  snprintf(fmt_time::ts + sVar3,7,"%02u.%03u",(ulong)((uint)(long)sec % 0x3c),
           (long)((sec - (double)((long)sec & 0xffffffff)) * 1000.0) & 0xffffffff);
  return fmt_time::ts;
}

Assistant:

static const char *
fmt_time(double sec) {
    static char ts[256];
    unsigned int i_sec;
    unsigned int i_min;
    unsigned int i_hour;

    ts[0] = '\0';

    i_sec = (unsigned int)sec;
    i_min = i_sec / 60;
    i_sec = i_sec % 60;
    i_hour = i_min / 60;
    i_min = i_min % 60;

    if(i_hour > 0) {
        snprintf(ts,4,"%02u:",i_hour);
    }
    if(i_min > 0) {
        snprintf(&ts[strlen(ts)],4,"%02u:",i_min);
    }
    snprintf(&ts[strlen(ts)],7,"%02u.%03u",i_sec, (unsigned int)((sec - (unsigned int)sec) * 1000));

    return (const char *)ts;
}